

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

void __thiscall QProgressBar::setOrientation(QProgressBar *this,Orientation orientation)

{
  long lVar1;
  bool bVar2;
  QProgressBarPrivate *this_00;
  Orientation in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QProgressBarPrivate *d;
  bool in_stack_00000033;
  WidgetAttribute in_stack_00000034;
  QWidget *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffd0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  QWidget *pQVar3;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = d_func((QProgressBar *)0x66356d);
  policy.data = (quint32)((ulong)pQVar3 >> 0x20);
  if (this_00->orientation != in_ESI) {
    this_00->orientation = in_ESI;
    bVar2 = QWidget::testAttribute((QWidget *)this_00,in_stack_ffffffffffffffd4.data);
    if (!bVar2) {
      QWidget::sizePolicy((QWidget *)
                          CONCAT44(in_stack_ffffffffffffffd4.data,in_stack_ffffffffffffffd0));
      in_stack_ffffffffffffffd4.bits =
           (Bits)QSizePolicy::transposed
                           ((QSizePolicy *)
                            CONCAT44(in_stack_ffffffffffffffd4.data,in_stack_ffffffffffffffd0));
      QWidget::setSizePolicy
                ((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),(QSizePolicy)policy);
      QWidget::setAttribute(in_stack_00000038,in_stack_00000034,in_stack_00000033);
    }
    QProgressBarPrivate::resetLayoutItemMargins(this_00);
    QWidget::update(in_RDI);
    QWidget::updateGeometry
              ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4.data,in_stack_ffffffffffffffd0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressBar::setOrientation(Qt::Orientation orientation)
{
    Q_D(QProgressBar);
    if (d->orientation == orientation)
        return;
    d->orientation = orientation;
    if (!testAttribute(Qt::WA_WState_OwnSizePolicy)) {
        setSizePolicy(sizePolicy().transposed());
        setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    }
    d->resetLayoutItemMargins();
    update();
    updateGeometry();
}